

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O3

jint Java_beagle_BeagleJNIWrapper_setCategoryRatesWithIndex
               (JNIEnv *env,jobject obj,jint instance,jint categoryRatesIndex,
               jdoubleArray inCategoryRates)

{
  jint jVar1;
  jdouble *pjVar2;
  
  pjVar2 = (*env->functions->GetDoubleArrayElements)(env,inCategoryRates,(jboolean *)0x0);
  jVar1 = beagleSetCategoryRatesWithIndex(instance,categoryRatesIndex,pjVar2);
  (*env->functions->ReleaseDoubleArrayElements)(env,inCategoryRates,pjVar2,2);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_setCategoryRatesWithIndex
  (JNIEnv *env, jobject obj, jint instance, jint categoryRatesIndex, jdoubleArray inCategoryRates)
{
    jdouble *categoryRates = env->GetDoubleArrayElements(inCategoryRates, NULL);

    jint errCode = (jint)beagleSetCategoryRatesWithIndex(instance,
                                                         categoryRatesIndex,
                                                         (double *)categoryRates);

    env->ReleaseDoubleArrayElements(inCategoryRates, categoryRates, JNI_ABORT);

    return errCode;
}